

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord2.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::ConeRecord2::ConeRecord2
          (ConeRecord2 *this,KUINT8 Index,WorldCoordinates *VertexLocation,EulerAngles *Orientation,
          Vector *Velocity,Vector *AngularVelocity,KFLOAT32 Height,KFLOAT32 PeakAngle,
          KFLOAT32 DHeightOverDt,KFLOAT32 DPeakAngleOverDt)

{
  KFLOAT32 DPeakAngleOverDt_local;
  KFLOAT32 DHeightOverDt_local;
  KFLOAT32 PeakAngle_local;
  KFLOAT32 Height_local;
  Vector *AngularVelocity_local;
  Vector *Velocity_local;
  EulerAngles *Orientation_local;
  WorldCoordinates *VertexLocation_local;
  KUINT8 Index_local;
  ConeRecord2 *this_local;
  
  ConeRecord1::ConeRecord1
            (&this->super_ConeRecord1,Index,VertexLocation,Orientation,Height,PeakAngle);
  (this->super_ConeRecord1).super_EnvironmentRecord.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__ConeRecord2_00340920;
  Vector::Vector(&this->m_Velocity,Velocity);
  Vector::Vector(&this->m_AngularVelocity,AngularVelocity);
  this->m_f32ddtHeight = DHeightOverDt;
  this->m_f32ddtPeak = DPeakAngleOverDt;
  (this->super_ConeRecord1).super_EnvironmentRecord.m_ui32EnvRecTyp = 0x30000000;
  (this->super_ConeRecord1).super_EnvironmentRecord.m_ui16Length = 0x2c0;
  return;
}

Assistant:

ConeRecord2::ConeRecord2( KUINT8 Index, const WorldCoordinates & VertexLocation, const EulerAngles & Orientation,
                          const Vector & Velocity, const Vector & AngularVelocity, KFLOAT32 Height,
                          KFLOAT32 PeakAngle, KFLOAT32 DHeightOverDt, KFLOAT32 DPeakAngleOverDt ) :
    ConeRecord1( Index, VertexLocation, Orientation, Height, PeakAngle ),
    m_Velocity( Velocity ),
    m_AngularVelocity( AngularVelocity ),
    m_f32ddtHeight( DHeightOverDt ),
    m_f32ddtPeak( DPeakAngleOverDt )
{
    m_ui32EnvRecTyp = ConeRecord2Type;
    m_ui16Length = CONE_RECORD_2_SIZE * 8;
}